

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O2

int tr_tcp_send(void *tr_tcp_sock,void *pdu,size_t len,time_t timeout)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  timeval t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (timeout == 0) {
    iVar4 = *tr_tcp_sock;
    iVar5 = 0x40;
  }
  else {
    t.tv_usec = 0;
    t.tv_sec = timeout;
    iVar4 = setsockopt(*tr_tcp_sock,1,0x15,&t,0x10);
    if (iVar4 == -1) {
      uVar2 = *(undefined8 *)((long)tr_tcp_sock + 8);
      uVar3 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      lrtr_dbg("TCP Transport(%s:%s): setting SO_SNDTIMEO failed, %s",uVar2,uVar3,pcVar8);
      iVar4 = -1;
      goto LAB_00109056;
    }
    iVar4 = *tr_tcp_sock;
    iVar5 = 0;
  }
  sVar6 = send(iVar4,pdu,len,iVar5);
  iVar5 = (int)sVar6;
  iVar4 = -1;
  if ((iVar5 != 0) && (iVar4 = iVar5, iVar5 == -1)) {
    piVar7 = __errno_location();
    iVar4 = *piVar7;
    if (iVar4 == 0xb) {
      iVar4 = -2;
    }
    else if (iVar4 == 4) {
      iVar4 = -3;
    }
    else {
      uVar2 = *(undefined8 *)((long)tr_tcp_sock + 8);
      uVar3 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
      pcVar8 = strerror(iVar4);
      lrtr_dbg("TCP Transport(%s:%s): send(..) error: %s",uVar2,uVar3,pcVar8);
      iVar4 = -1;
    }
  }
LAB_00109056:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int tr_tcp_send(const void *tr_tcp_sock, const void *pdu, const size_t len, const time_t timeout)
{
	const struct tr_tcp_socket *tcp_socket = tr_tcp_sock;
	int rtval;

	if (timeout == 0) {
		rtval = send(tcp_socket->socket, pdu, len, MSG_DONTWAIT);
	} else {
		struct timeval t = {timeout, 0};

		if (setsockopt(tcp_socket->socket, SOL_SOCKET, SO_SNDTIMEO, &t, sizeof(t)) == -1) {
			TCP_DBG("setting SO_SNDTIMEO failed, %s", tcp_socket, strerror(errno));
			return TR_ERROR;
		}
		rtval = send(tcp_socket->socket, pdu, len, 0);
	}

	if (rtval == -1) {
		if (errno == EAGAIN || errno == EWOULDBLOCK)
			return TR_WOULDBLOCK;
		if (errno == EINTR)
			return TR_INTR;
		TCP_DBG("send(..) error: %s", tcp_socket, strerror(errno));
		return TR_ERROR;
	}
	if (rtval == 0)
		return TR_ERROR;
	return rtval;
}